

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcache.c
# Opt level: O3

void tcache_destroy(tsd_t *tsd,tcache_t *tcache,_Bool tsd_tcache)

{
  long *plVar1;
  ulong *puVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  tcache_slow_t *tcache_slow;
  arena_t *arena;
  void *ptr;
  uintptr_t uVar5;
  void *pvVar6;
  ulong uVar7;
  undefined8 uVar8;
  _Bool _Var9;
  uint uVar10;
  rtree_leaf_elm_t *prVar11;
  undefined7 in_register_00000011;
  tcache_t *tcache_00;
  rtree_leaf_elm_t *extraout_RDX;
  rtree_leaf_elm_t *extraout_RDX_00;
  rtree_leaf_elm_t *extraout_RDX_01;
  rtree_leaf_elm_t *extraout_RDX_02;
  rtree_leaf_elm_t *extraout_RDX_03;
  rtree_leaf_elm_t *extraout_RDX_04;
  rtree_leaf_elm_t *extraout_RDX_05;
  rtree_leaf_elm_t *prVar12;
  rtree_leaf_elm_t *extraout_RDX_06;
  atomic_p_t arena_00;
  rtree_ctx_t *prVar13;
  ulong uVar14;
  rtree_ctx_t rtree_ctx_fallback;
  rtree_ctx_t local_1b0;
  
  tcache_slow = tcache->tcache_slow;
  tcache_flush_cache(tsd,tcache);
  arena = tcache_slow->arena;
  tcache_arena_dissociate((tsdn_t *)tsd,tcache_slow,tcache_00);
  prVar12 = extraout_RDX;
  if ((int)CONCAT71(in_register_00000011,tsd_tcache) != 0) {
    _Var9 = duckdb_je_cache_bin_stack_use_thp();
    prVar12 = extraout_RDX_00;
    if (_Var9) {
      duckdb_je_b0_dalloc_tcache_stack((tsdn_t *)tsd,tcache_slow->dyn_alloc);
      goto LAB_011845fc;
    }
  }
  ptr = tcache_slow->dyn_alloc;
  if (tsd == (tsd_t *)0x0) {
    prVar13 = &local_1b0;
    duckdb_je_rtree_ctx_data_init(prVar13);
    prVar12 = extraout_RDX_01;
  }
  else {
    prVar13 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  uVar10 = (uint)((ulong)ptr >> 0x1e) & 0xf;
  uVar14 = (ulong)ptr & 0xffffffffc0000000;
  puVar2 = (ulong *)((long)&prVar13->cache[0].leafkey + (ulong)(uVar10 << 4));
  uVar5 = *(uintptr_t *)((long)&prVar13->cache[0].leafkey + (ulong)(uVar10 << 4));
  if (uVar5 == uVar14) {
    prVar11 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8) + puVar2[1]);
  }
  else if (prVar13->l2_cache[0].leafkey == uVar14) {
    prVar12 = prVar13->l2_cache[0].leaf;
    prVar13->l2_cache[0].leafkey = uVar5;
    prVar13->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar2[1];
    *puVar2 = uVar14;
    puVar2[1] = (ulong)prVar12;
    prVar11 = (rtree_leaf_elm_t *)
              ((long)&(prVar12->le_bits).repr + (ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8));
  }
  else {
    prVar12 = (rtree_leaf_elm_t *)0x118;
    do {
      if (*(ulong *)((long)&prVar13[-1].l2_cache[7].leaf + (long)prVar12) == uVar14) {
        uVar7 = *(ulong *)((long)&prVar13->cache[0].leafkey + (long)&(prVar12->le_bits).repr);
        puVar3 = (undefined8 *)((long)&prVar13[-1].l2_cache[6].leaf + (long)prVar12);
        uVar8 = puVar3[1];
        puVar4 = (undefined8 *)((long)&prVar13[-1].l2_cache[7].leaf + (long)prVar12);
        *puVar4 = *puVar3;
        puVar4[1] = uVar8;
        *(uintptr_t *)((long)&prVar13[-1].l2_cache[6].leaf + (long)prVar12) = uVar5;
        *(ulong *)((long)&(prVar12->le_bits).repr + (long)&prVar13[-1].l2_cache[7].leafkey) =
             puVar2[1];
        *puVar2 = uVar14;
        puVar2[1] = uVar7;
        prVar11 = (rtree_leaf_elm_t *)(((uint)((ulong)ptr >> 9) & 0x1ffff8) + uVar7);
        goto LAB_01184542;
      }
      prVar12 = prVar12 + 2;
    } while (prVar12 != (rtree_leaf_elm_t *)0x188);
    prVar11 = duckdb_je_rtree_leaf_elm_lookup_hard
                        ((tsdn_t *)tsd,&duckdb_je_arena_emap_global.rtree,prVar13,(uintptr_t)ptr,
                         true,false);
    prVar12 = extraout_RDX_04;
  }
LAB_01184542:
  pvVar6 = duckdb_je_arenas
           [*(uint *)(((long)(prVar11->le_bits).repr << 0x10) >> 0x10 & 0xffffffffffffff80) & 0xfff]
           .repr;
  if (tsd == (tsd_t *)0x0) {
    prVar13 = &local_1b0;
    duckdb_je_rtree_ctx_data_init(prVar13);
    prVar12 = extraout_RDX_02;
  }
  else {
    prVar13 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  puVar2 = (ulong *)((long)&prVar13->cache[0].leafkey + (ulong)(uVar10 << 4));
  uVar5 = *(uintptr_t *)((long)&prVar13->cache[0].leafkey + (ulong)(uVar10 << 4));
  if (uVar5 == uVar14) {
    prVar11 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8) + puVar2[1]);
  }
  else if (prVar13->l2_cache[0].leafkey == uVar14) {
    prVar12 = prVar13->l2_cache[0].leaf;
    prVar13->l2_cache[0].leafkey = uVar5;
    prVar13->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar2[1];
    *puVar2 = uVar14;
    puVar2[1] = (ulong)prVar12;
    prVar11 = (rtree_leaf_elm_t *)
              ((long)&(prVar12->le_bits).repr + (ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8));
  }
  else {
    prVar12 = (rtree_leaf_elm_t *)0x118;
    do {
      if (*(ulong *)((long)&prVar13[-1].l2_cache[7].leaf + (long)prVar12) == uVar14) {
        uVar7 = *(ulong *)((long)&prVar13->cache[0].leafkey + (long)&(prVar12->le_bits).repr);
        puVar3 = (undefined8 *)((long)&prVar13[-1].l2_cache[6].leaf + (long)prVar12);
        uVar8 = puVar3[1];
        puVar4 = (undefined8 *)((long)&prVar13[-1].l2_cache[7].leaf + (long)prVar12);
        *puVar4 = *puVar3;
        puVar4[1] = uVar8;
        *(uintptr_t *)((long)&prVar13[-1].l2_cache[6].leaf + (long)prVar12) = uVar5;
        *(ulong *)((long)&(prVar12->le_bits).repr + (long)&prVar13[-1].l2_cache[7].leafkey) =
             puVar2[1];
        *puVar2 = uVar14;
        puVar2[1] = uVar7;
        prVar11 = (rtree_leaf_elm_t *)(((uint)((ulong)ptr >> 9) & 0x1ffff8) + uVar7);
        goto LAB_01184598;
      }
      prVar12 = prVar12 + 2;
    } while (prVar12 != (rtree_leaf_elm_t *)0x188);
    prVar11 = duckdb_je_rtree_leaf_elm_lookup_hard
                        ((tsdn_t *)tsd,&duckdb_je_arena_emap_global.rtree,prVar13,(uintptr_t)ptr,
                         true,false);
    prVar12 = extraout_RDX_05;
  }
LAB_01184598:
  LOCK();
  plVar1 = (long *)((long)pvVar6 + 0x48);
  *plVar1 = *plVar1 - duckdb_je_sz_index2size_tab[(ulong)(prVar11->le_bits).repr >> 0x30];
  UNLOCK();
  if (tsd == (tsd_t *)0x0) {
    prVar13 = &local_1b0;
    duckdb_je_rtree_ctx_data_init(prVar13);
    prVar12 = extraout_RDX_03;
  }
  else {
    prVar13 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  puVar2 = (ulong *)((long)&prVar13->cache[0].leafkey + (ulong)(uVar10 << 4));
  uVar5 = *(uintptr_t *)((long)&prVar13->cache[0].leafkey + (ulong)(uVar10 << 4));
  if (uVar5 == uVar14) {
    prVar11 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8) + puVar2[1]);
  }
  else if (prVar13->l2_cache[0].leafkey == uVar14) {
    prVar12 = prVar13->l2_cache[0].leaf;
    prVar13->l2_cache[0].leafkey = uVar5;
    prVar13->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar2[1];
    *puVar2 = uVar14;
    puVar2[1] = (ulong)prVar12;
    prVar11 = (rtree_leaf_elm_t *)
              ((long)&(prVar12->le_bits).repr + (ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8));
  }
  else {
    prVar12 = (rtree_leaf_elm_t *)0x118;
    do {
      if (*(ulong *)((long)&prVar13[-1].l2_cache[7].leaf + (long)prVar12) == uVar14) {
        uVar7 = *(ulong *)((long)&prVar13->cache[0].leafkey + (long)&(prVar12->le_bits).repr);
        puVar3 = (undefined8 *)((long)&prVar13[-1].l2_cache[6].leaf + (long)prVar12);
        uVar8 = puVar3[1];
        puVar4 = (undefined8 *)((long)&prVar13[-1].l2_cache[7].leaf + (long)prVar12);
        *puVar4 = *puVar3;
        puVar4[1] = uVar8;
        *(uintptr_t *)((long)&prVar13[-1].l2_cache[6].leaf + (long)prVar12) = uVar5;
        *(ulong *)((long)&(prVar12->le_bits).repr + (long)&prVar13[-1].l2_cache[7].leafkey) =
             puVar2[1];
        *puVar2 = uVar14;
        puVar2[1] = uVar7;
        prVar11 = (rtree_leaf_elm_t *)(((uint)((ulong)ptr >> 9) & 0x1ffff8) + uVar7);
        goto LAB_011845e2;
      }
      prVar12 = prVar12 + 2;
    } while (prVar12 != (rtree_leaf_elm_t *)0x188);
    prVar11 = duckdb_je_rtree_leaf_elm_lookup_hard
                        ((tsdn_t *)tsd,&duckdb_je_arena_emap_global.rtree,prVar13,(uintptr_t)ptr,
                         true,false);
    prVar12 = extraout_RDX_06;
  }
LAB_011845e2:
  if (((ulong)(prVar11->le_bits).repr & 1) == 0) {
    arena_dalloc_large_no_tcache((tsdn_t *)tsd,ptr,(szind_t)prVar12);
  }
  else {
    duckdb_je_arena_dalloc_small((tsdn_t *)tsd,ptr);
  }
LAB_011845fc:
  arena_00.repr = duckdb_je_arenas[0].repr;
  if (duckdb_je_arenas[0].repr == (void *)0x0) {
    arena_00.repr = (arena_t *)0x0;
  }
  duckdb_je_arena_decay((tsdn_t *)tsd,(arena_t *)arena_00.repr,false,false);
  uVar10 = duckdb_je_arena_nthreads_get(arena,false);
  if ((uVar10 != 0) || (_Var9 = true, (duckdb_je_background_thread_enabled_state.repr & 1U) != 0)) {
    _Var9 = false;
  }
  duckdb_je_arena_decay((tsdn_t *)tsd,arena,false,_Var9);
  return;
}

Assistant:

static void
tcache_destroy(tsd_t *tsd, tcache_t *tcache, bool tsd_tcache) {
	tcache_slow_t *tcache_slow = tcache->tcache_slow;
	tcache_flush_cache(tsd, tcache);
	arena_t *arena = tcache_slow->arena;
	tcache_arena_dissociate(tsd_tsdn(tsd), tcache_slow, tcache);

	if (tsd_tcache) {
		cache_bin_t *cache_bin = &tcache->bins[0];
		cache_bin_assert_empty(cache_bin);
	}
	if (tsd_tcache && cache_bin_stack_use_thp()) {
		b0_dalloc_tcache_stack(tsd_tsdn(tsd), tcache_slow->dyn_alloc);
	} else {
		idalloctm(tsd_tsdn(tsd), tcache_slow->dyn_alloc, NULL, NULL,
		    true, true);
	}

	/*
	 * The deallocation and tcache flush above may not trigger decay since
	 * we are on the tcache shutdown path (potentially with non-nominal
	 * tsd).  Manually trigger decay to avoid pathological cases.  Also
	 * include arena 0 because the tcache array is allocated from it.
	 */
	arena_decay(tsd_tsdn(tsd), arena_get(tsd_tsdn(tsd), 0, false),
	    false, false);

	if (arena_nthreads_get(arena, false) == 0 &&
	    !background_thread_enabled()) {
		/* Force purging when no threads assigned to the arena anymore. */
		arena_decay(tsd_tsdn(tsd), arena,
		    /* is_background_thread */ false, /* all */ true);
	} else {
		arena_decay(tsd_tsdn(tsd), arena,
		    /* is_background_thread */ false, /* all */ false);
	}
}